

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

int invertroot(int q,double *ma)

{
  size_t __size;
  double dVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  double *coeff;
  double *ZEROR;
  double *ZEROI;
  void *__ptr;
  long lVar5;
  undefined8 *__ptr_00;
  undefined8 *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint DEGREE;
  long lVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  uVar4 = 0;
  uVar8 = 0;
  if (0 < q) {
    uVar8 = (ulong)(uint)q;
  }
  uVar12 = 0xffffffffffffffff;
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    if (ma[uVar4] != 0.0) {
      uVar12 = uVar4;
    }
    if (NAN(ma[uVar4])) {
      uVar12 = uVar4;
    }
    uVar12 = uVar12 & 0xffffffff;
  }
  iVar11 = (int)uVar12;
  if (iVar11 == -1) {
    return 0;
  }
  lVar10 = (long)q;
  coeff = (double *)malloc(lVar10 * 8 + 8);
  ZEROR = (double *)malloc(lVar10 * 8);
  ZEROI = (double *)malloc(lVar10 * 8);
  __ptr = malloc(lVar10 * 4);
  DEGREE = iVar11 + 1;
  *coeff = 1.0;
  uVar8 = 0;
  uVar4 = 0;
  if (0 < (int)DEGREE) {
    uVar4 = (ulong)DEGREE;
  }
  for (; uVar4 != uVar8; uVar8 = uVar8 + 1) {
    coeff[uVar8 + 1] = ma[uVar8];
  }
  lVar5 = (long)iVar11;
  __size = lVar5 * 8 + 0x10;
  __ptr_00 = (undefined8 *)malloc(__size);
  __ptr_01 = (undefined8 *)malloc(__size);
  __ptr_02 = malloc(__size);
  __ptr_03 = malloc(__size);
  iVar3 = polyroot(coeff,DEGREE,ZEROR,ZEROI);
  if (iVar3 == 1) {
    free(ZEROR);
  }
  else {
    iVar3 = 0;
    for (lVar6 = 0; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
      dVar13 = ZEROR[lVar6];
      dVar1 = ZEROI[lVar6];
      *(undefined4 *)((long)__ptr + lVar6 * 4) = 0;
      if (dVar13 * dVar13 + dVar1 * dVar1 < 1.0) {
        *(undefined4 *)((long)__ptr + lVar6 * 4) = 1;
        iVar3 = iVar3 + 1;
      }
    }
    if (iVar3 != 0) {
      if (iVar11 == 0) {
        *ma = 1.0 / *ma;
        for (lVar5 = 1; lVar5 < lVar10; lVar5 = lVar5 + 1) {
          ma[lVar5] = 0.0;
        }
      }
      else {
        for (lVar6 = 0; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
          if (*(int *)((long)__ptr + lVar6 * 4) == 1) {
            dVar13 = ZEROR[lVar6];
            dVar1 = ZEROI[lVar6];
            dVar14 = dVar13 * dVar13 + dVar1 * dVar1;
            ZEROR[lVar6] = dVar13 / dVar14;
            ZEROI[lVar6] = -dVar1 / dVar14;
          }
        }
        *__ptr_01 = 0;
        *__ptr_00 = 0x3ff0000000000000;
        lVar6 = 0;
        while (lVar7 = lVar6, lVar7 <= lVar5) {
          dVar13 = ZEROR[lVar7];
          dVar1 = ZEROI[lVar7];
          dVar14 = dVar13 * dVar13 + dVar1 * dVar1;
          dVar13 = dVar13 / dVar14;
          __ptr_01[lVar7 + 1] = 0;
          __ptr_00[lVar7 + 1] = 0;
          dVar14 = -dVar1 / dVar14;
          for (lVar6 = -1; lVar9 = -1, lVar7 != lVar6; lVar6 = lVar6 + 1) {
            dVar1 = (double)__ptr_01[lVar6 + 1];
            dVar2 = (double)__ptr_00[lVar6 + 1];
            *(double *)((long)__ptr_02 + lVar6 * 8 + 0x10) =
                 (double)__ptr_00[lVar6 + 2] - (dVar13 * dVar2 + dVar1 * -dVar14);
            *(double *)((long)__ptr_03 + lVar6 * 8 + 0x10) =
                 (double)__ptr_01[lVar6 + 2] - (dVar1 * dVar13 + dVar2 * dVar14);
          }
          for (; lVar6 = lVar7 + 1, lVar7 != lVar9; lVar9 = lVar9 + 1) {
            __ptr_00[lVar9 + 2] = *(undefined8 *)((long)__ptr_02 + lVar9 * 8 + 0x10);
            __ptr_01[lVar9 + 2] = *(undefined8 *)((long)__ptr_03 + lVar9 * 8 + 0x10);
          }
        }
        for (lVar6 = 0; lVar6 <= lVar5; lVar6 = lVar6 + 1) {
          ma[lVar6] = (double)__ptr_00[lVar6 + 1];
        }
        for (lVar5 = (long)(int)DEGREE; lVar5 < lVar10; lVar5 = lVar5 + 1) {
          ma[lVar5] = 0.0;
        }
      }
      free(ZEROR);
      free(ZEROI);
      free(coeff);
      iVar11 = 1;
      goto LAB_0012eb6a;
    }
    free(ZEROR);
  }
  free(ZEROI);
  free(coeff);
  iVar11 = 0;
LAB_0012eb6a:
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(__ptr_03);
  return iVar11;
}

Assistant:

int invertroot(int q, double *ma) {
	int i, index, retval, fail, rcheck, qn, i1, j;
	double *temp, *zeror, *zeroi, *xr, *xi,*yr,*yi;
	int *ind;
	double mod,tempr,tempi;


	retval = 0;
	index = -1;
	for (i = 0; i < q; ++i) {
		if (ma[i] != 0.0) {
			index = i;
		}
	}

	if (index == -1) {
		return retval;
	}
	
	temp = (double*)malloc(sizeof(double)* (q + 1));
	zeror = (double*)malloc(sizeof(double)* q);
	zeroi = (double*)malloc(sizeof(double)* q);
	ind = (int*)malloc(sizeof(int)* q);

	index++;
	temp[0] = 1.0;
	for (i = 1; i <= index; ++i) {
		temp[i] = ma[i - 1];
	}

	qn = index;

	xr = (double*)malloc(sizeof(double)* (qn + 1));
	xi = (double*)malloc(sizeof(double)* (qn + 1));
	yr = (double*)malloc(sizeof(double)* (qn + 1));
	yi = (double*)malloc(sizeof(double)* (qn + 1));

	fail = polyroot(temp, qn, zeror, zeroi);

	//mdisplay(zeroi, 1, qn);

	if (fail == 1) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	rcheck = 0;

	for (i = 0; i < qn; ++i) {
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		ind[i] = 0;
		if (mod < 1.0) {
			ind[i] = 1;
			rcheck++;
		}
	}

	if (rcheck == 0) {
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}
	else {
		retval = 1;
	}

	if (index == 1) {
		ma[0] = 1.0 / ma[0];
		for (i = 1; i < q; ++i) {
			ma[i] = 0.0;
		}
		free(zeror);
		free(zeroi);
		free(temp);
		free(ind);
		free(xr);
		free(xi);
		free(yr);
		free(yi);
		return retval;
	}

	for (i = 0; i < index; ++i) {
		if (ind[i] == 1) {
			mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
			zeror[i] = zeror[i] / mod;
			zeroi[i] = -zeroi[i] / mod;
		}
	}

	//mdisplay(zeroi, 1, qn);

	xr[0] = 1.0; xi[0] = 0.0;
	yr[0] = xr[0];
	yi[0] = xi[0];

	for (i = 0; i < qn; ++i) {
		i1 = i + 1;
		mod = zeror[i] * zeror[i] + zeroi[i] * zeroi[i];
		tempr = zeror[i] / mod;
		tempi = -zeroi[i] / mod;
		xr[i1] = xi[i1] = 0.0;
		for (j = 1; j <= i1; ++j) {
			yr[j] = tempr * xr[j - 1] - tempi * xi[j - 1];
			yi[j] = tempr * xi[j - 1] + tempi * xr[j - 1];
			yr[j] = xr[j] - yr[j];
			yi[j] = xi[j] - yi[j];
		}
		for (j = 1; j <= i1; ++j) {
			xr[j] = yr[j];
			xi[j] = yi[j];
		}
		//mdisplay(xr, 1, qn+1);
	}

	for (i = 0; i < qn; ++i) {
		ma[i] = xr[i+1];
	}

	for (i = qn; i < q; ++i) {
		ma[i] = 0.0;
	}

	free(zeror);
	free(zeroi);
	free(temp);
	free(ind);
	free(xr);
	free(xi);
	free(yr);
	free(yi);
	return retval;
}